

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall
CorUnix::CPalSynchronizationManager::UnRegisterWait
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,ThreadWaitInfo *ptwiWaitInfo,
          bool fHaveSharedLock)

{
  _WaitingThreadsListNode *pobj;
  bool bVar1;
  LPVOID pvVar2;
  WTLNodeGenrPtr *pWVar3;
  WaitingThreadsListNode *pwtlnItemPrev;
  WaitingThreadsListNode *pwtlnItemNext;
  WaitingThreadsListNode *pwtlnItem;
  CSynchData *pCStack_30;
  bool fSharedSynchLock;
  CSynchData *psdSynchData;
  int i;
  bool fHaveSharedLock_local;
  ThreadWaitInfo *ptwiWaitInfo_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  bVar1 = false;
  if ((!fHaveSharedLock) && (ptwiWaitInfo->wdWaitDomain != LocalWait)) {
    AcquireSharedSynchLock(pthrCurrent);
    bVar1 = true;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CPalThread::GetThreadId(ptwiWaitInfo->pthrOwner);
  for (psdSynchData._0_4_ = 0; (int)psdSynchData < ptwiWaitInfo->lObjCount;
      psdSynchData._0_4_ = (int)psdSynchData + 1) {
    pobj = ptwiWaitInfo->rgpWTLNodes[(int)psdSynchData];
    if ((pobj->dwFlags & 1) == 0) {
      pCStack_30 = (pobj->ptrOwnerObjSynchData).ptr;
      if ((pobj->ptrPrev).shrid == 0) {
        CSynchData::SetWTLHeadPtr(pCStack_30,(pobj->ptrNext).ptr);
      }
      else {
        ((pobj->ptrPrev).ptr)->ptrNext = pobj->ptrNext;
      }
      if ((pobj->ptrNext).shrid == 0) {
        CSynchData::SetWTLTailPtr(pCStack_30,(pobj->ptrPrev).ptr);
      }
      else {
        ((pobj->ptrNext).ptr)->ptrPrev = pobj->ptrPrev;
      }
      CSynchCache<CorUnix::_WaitingThreadsListNode>::Add(&this->m_cacheWTListNodes,pthrCurrent,pobj)
      ;
    }
    else {
      pCStack_30 = (CSynchData *)SHMPtrToPtr((pobj->ptrOwnerObjSynchData).shrid);
      pvVar2 = SHMPtrToPtr((pobj->ptrNext).shrid);
      pWVar3 = (WTLNodeGenrPtr *)SHMPtrToPtr((pobj->ptrPrev).shrid);
      if (pWVar3 == (WTLNodeGenrPtr *)0x0) {
        CSynchData::SetWTLHeadShrPtr(pCStack_30,(pobj->ptrNext).shrid);
      }
      else {
        *pWVar3 = pobj->ptrNext;
      }
      if (pvVar2 == (LPVOID)0x0) {
        CSynchData::SetWTLTailShrPtr(pCStack_30,(pobj->ptrPrev).shrid);
      }
      else {
        *(WTLNodeGenrPtr *)((long)pvVar2 + 8) = pobj->ptrPrev;
      }
      CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                (&this->m_cacheSHRWTListNodes,pthrCurrent,pobj->shridSHRThis);
    }
    CSynchData::DecrementWaitingThreadCount(pCStack_30);
    CSynchData::Release(pCStack_30,pthrCurrent);
  }
  ptwiWaitInfo->lObjCount = 0;
  ptwiWaitInfo->lSharedObjCount = 0;
  ptwiWaitInfo->wdWaitDomain = LocalWait;
  if (bVar1) {
    ReleaseSharedSynchLock(pthrCurrent);
  }
  return;
}

Assistant:

void CPalSynchronizationManager::UnRegisterWait(
        CPalThread * pthrCurrent,
        ThreadWaitInfo * ptwiWaitInfo,
        bool fHaveSharedLock)
    {
        int i = 0;
        CSynchData * psdSynchData = NULL;
        bool fSharedSynchLock = false;

        if (!fHaveSharedLock && LocalWait != ptwiWaitInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        TRACE("Unregistering wait for thread=%u [ObjCount=%d WaitType=%u WaitDomain=%u]\n",
              ptwiWaitInfo->pthrOwner->GetThreadId(),
              ptwiWaitInfo->lObjCount, ptwiWaitInfo->wtWaitType,
              ptwiWaitInfo->wdWaitDomain);

        for (i=0; i < ptwiWaitInfo->lObjCount; i++)
        {
            WaitingThreadsListNode * pwtlnItem = ptwiWaitInfo->rgpWTLNodes[i];

            VALIDATEOBJECT(pwtlnItem);

            if (pwtlnItem->dwFlags & WTLN_FLAG_OWNER_OBJECT_IS_SHARED)
            {
                // Shared object
                WaitingThreadsListNode * pwtlnItemNext, * pwtlnItemPrev;

                psdSynchData = SharedIDToTypePointer(CSynchData,
                    pwtlnItem->ptrOwnerObjSynchData.shrid);

                VALIDATEOBJECT(psdSynchData);

                pwtlnItemNext = SharedIDToTypePointer(WaitingThreadsListNode,
                    pwtlnItem->ptrNext.shrid);
                pwtlnItemPrev = SharedIDToTypePointer(WaitingThreadsListNode,
                    pwtlnItem->ptrPrev.shrid);
                if (pwtlnItemPrev)
                {
                    VALIDATEOBJECT(pwtlnItemPrev);
                    pwtlnItemPrev->ptrNext.shrid = pwtlnItem->ptrNext.shrid;
                }
                else
                {
                    psdSynchData->SetWTLHeadShrPtr(pwtlnItem->ptrNext.shrid);
                }
                if (pwtlnItemNext)
                {
                    VALIDATEOBJECT(pwtlnItemNext);
                    pwtlnItemNext->ptrPrev.shrid = pwtlnItem->ptrPrev.shrid;
                }
                else
                {
                    psdSynchData->SetWTLTailShrPtr(pwtlnItem->ptrPrev.shrid);
                }

                m_cacheSHRWTListNodes.Add(pthrCurrent, pwtlnItem->shridSHRThis);
            }
            else
            {
                // Local object
                psdSynchData = pwtlnItem->ptrOwnerObjSynchData.ptr;

                VALIDATEOBJECT(psdSynchData);

                if (pwtlnItem->ptrPrev.ptr)
                {
                    VALIDATEOBJECT(pwtlnItem);
                    pwtlnItem->ptrPrev.ptr->ptrNext.ptr = pwtlnItem->ptrNext.ptr;
                }
                else
                {
                    psdSynchData->SetWTLHeadPtr(pwtlnItem->ptrNext.ptr);
                }
                if (pwtlnItem->ptrNext.ptr)
                {
                    VALIDATEOBJECT(pwtlnItem);
                    pwtlnItem->ptrNext.ptr->ptrPrev.ptr = pwtlnItem->ptrPrev.ptr;
                }
                else
                {
                    psdSynchData->SetWTLTailPtr(pwtlnItem->ptrPrev.ptr);
                }

                m_cacheWTListNodes.Add(pthrCurrent, pwtlnItem);
            }

            // Release the node's refcount on the synch data, and decerement
            // waiting thread count
            psdSynchData->DecrementWaitingThreadCount();
            psdSynchData->Release(pthrCurrent);
        }

        // Reset wait data in ThreadWaitInfo structure: it is enough
        // to reset lObjCount, lSharedObjCount and wdWaitDomain.
        ptwiWaitInfo->lObjCount       = 0;
        ptwiWaitInfo->lSharedObjCount = 0;
        ptwiWaitInfo->wdWaitDomain    = LocalWait;

        // Done
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        return;
    }